

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

void __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_>::CalcResidualInternal<double>
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *this,
          TPZElementMatrixT<double> *ef)

{
  int iVar1;
  TPZInterpolationSpace *pTVar2;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *pTVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  long *plVar10;
  long lVar11;
  TPZPostProcMat *this_00;
  double *pdVar12;
  TPZGeoEl *pTVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  int64_t size;
  REAL weight;
  REAL weightRef;
  TPZVec<double> Sol;
  TPZManVector<double,_3> intpointRef;
  TPZManVector<double,_3> intpoint;
  TPZManVector<int,_10> varIndex;
  TPZFNMatrix<9,_double> rhsCopy;
  TPZFNMatrix<1,_double> efTemp;
  TPZFNMatrix<90,_double> ekCopy;
  TPZMaterialDataT<double> dataRef;
  TPZMaterialDataT<double> data;
  long *plStack_10c80;
  double dStack_10c78;
  TPZElementMatrixT<double> *pTStack_10c70;
  double dStack_10c68;
  long *plStack_10c60;
  long *plStack_10c58;
  TPZVec<double> TStack_10c50;
  _func_int **pp_Stack_10c30;
  _func_int **pp_Stack_10c28;
  long *plStack_10c20;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>_> *pTStack_10c18;
  TPZPostProcMat *pTStack_10c10;
  long lStack_10c08;
  TPZManVector<double,_3> TStack_10c00;
  TPZManVector<double,_3> TStack_10bc8;
  TPZManVector<int,_10> TStack_10b90;
  TPZFMatrix<double> TStack_10b48;
  double adStack_10ab8 [10];
  TPZFMatrix<double> TStack_10a68;
  double adStack_109d8 [11];
  TPZFMatrix<double> TStack_10980;
  double adStack_108f0 [2];
  TPZFMatrix<double> TStack_108e0;
  double adStack_10850 [11];
  TPZFMatrix<double> TStack_107f8;
  double adStack_10768 [91];
  TPZMaterialDataT<double> TStack_10490;
  TPZMaterialDataT<double> local_8260;
  
  TPZElementMatrixT<double>::Reset(ef,(TPZCompMesh *)0x0,Unknown);
  (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                         super_TPZIntelGen<pzshape::TPZShapePoint>.super_TPZInterpolatedElement.
                         super_TPZInterpolationSpace.super_TPZCompEl + 0x100))(this,ef);
  pTVar2 = (this->super_TPZCompElPostProcBase).fReferredElement;
  if (pTVar2 == (TPZInterpolationSpace *)0x0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzcompelpostproc.h"
               ,0x49);
  }
  plVar9 = (long *)__dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
  plVar10 = (long *)__dynamic_cast(pTVar2,&TPZCompEl::typeinfo,&TPZMultiphysicsElement::typeinfo,0);
  lVar11 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                  super_TPZIntelGen<pzshape::TPZShapePoint>.
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0xb8))(this);
  if ((lVar11 != 0) &&
     (this_00 = (TPZPostProcMat *)
                __dynamic_cast(lVar11,&TPZMaterial::typeinfo,&TPZPostProcMat::typeinfo,0),
     this_00 != (TPZPostProcMat *)0x0)) {
    lVar11 = (**(code **)(*(long *)&pTVar2->super_TPZCompEl + 0xb8))(pTVar2);
    if (lVar11 == 0) {
      plStack_10c80 = (long *)0x0;
    }
    else {
      plStack_10c80 =
           (long *)__dynamic_cast(lVar11,&TPZMaterial::typeinfo,
                                  &TPZMatSingleSpaceT<double>::typeinfo,0xfffffffffffffffe);
    }
    iVar4 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                   super_TPZIntelGen<pzshape::TPZShapePoint>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar4 != 0) {
      uVar14 = (ef->fMat).super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow;
      TStack_10980.fElem = adStack_108f0;
      TStack_10980.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
      TStack_10980.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
      TStack_10980.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
      TStack_10980.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFMatrix_018ba970;
      TStack_10980.fSize = 1;
      pTStack_10c70 = ef;
      TStack_10980.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar14;
      TStack_10980.fGiven = TStack_10980.fElem;
      TPZVec<int>::TPZVec(&TStack_10980.fPivot.super_TPZVec<int>,0);
      TStack_10980.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498
      ;
      TStack_10980.fPivot.super_TPZVec<int>.fStore = TStack_10980.fPivot.fExtAlloc;
      TStack_10980.fPivot.super_TPZVec<int>.fNElements = 0;
      TStack_10980.fPivot.super_TPZVec<int>.fNAlloc = 0;
      TStack_10980.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
      TStack_10980.fWork.fStore = (double *)0x0;
      TStack_10980.fWork.fNElements = 0;
      TStack_10980.fWork.fNAlloc = 0;
      pdVar12 = (double *)0x0;
      if ((uVar14 != 0) && (pdVar12 = TStack_10980.fElem, 1 < (long)uVar14)) {
        pdVar12 = (double *)operator_new__(-(ulong)(uVar14 >> 0x3d != 0) | uVar14 << 3);
      }
      TStack_10980.fElem = pdVar12;
      TStack_10980.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)&PTR__TPZFNMatrix_018ba680;
      TPZFMatrix<double>::operator=(&TStack_10980,0.0);
      TPZMaterialDataT<double>::TPZMaterialDataT(&local_8260);
      TPZMaterialDataT<double>::TPZMaterialDataT(&TStack_10490);
      (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                             super_TPZIntelGen<pzshape::TPZShapePoint>.super_TPZInterpolatedElement.
                             super_TPZInterpolationSpace.super_TPZCompEl + 0x298))(this,&local_8260)
      ;
      if (plVar9 != (long *)0x0) {
        (**(code **)(*plVar9 + 0x298))(plVar9,&TStack_10490);
        TStack_10490.super_TPZMaterialData.fNeedsSol = true;
        TStack_10490.super_TPZMaterialData.p = (**(code **)(*plVar9 + 0x268))(plVar9);
      }
      local_8260.super_TPZMaterialData.p =
           (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                  super_TPZIntelGen<pzshape::TPZShapePoint>.
                                  super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                  super_TPZCompEl + 0x268))(this);
      pTVar13 = TPZCompEl::Reference((TPZCompEl *)this);
      iVar4 = (**(code **)(*(long *)pTVar13 + 0x210))(pTVar13);
      TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&TStack_10bc8,(long)iVar4,(double *)&TStack_107f8);
      TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
           (_func_int **)0x0;
      TPZManVector<double,_3>::TPZManVector(&TStack_10c00,(long)iVar4,(double *)&TStack_107f8);
      dStack_10c78 = 0.0;
      dStack_10c68 = 0.0;
      (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                             super_TPZIntelGen<pzshape::TPZShapePoint>.super_TPZInterpolatedElement.
                             super_TPZInterpolationSpace.super_TPZCompEl + 0x2c8))(this);
      plStack_10c58 =
           (long *)(**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                          super_TPZIntelGen<pzshape::TPZShapePoint>.
                                          super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                          super_TPZCompEl + 0x2c8))(this);
      plStack_10c60 = (long *)(**(code **)(*(long *)&pTVar2->super_TPZCompEl + 0x240))(pTVar2);
      iVar4 = (**(code **)(*plStack_10c58 + 0x18))();
      iVar5 = (**(code **)(*plStack_10c60 + 0x18))();
      if (iVar4 == iVar5) {
        uVar6 = (**(code **)(*(long *)&(this->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                       super_TPZIntelGen<pzshape::TPZShapePoint>.
                                       super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                       super_TPZCompEl + 600))(this);
        lVar11 = (long)(int)uVar6;
        TStack_10a68.fElem = adStack_109d8;
        TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        pp_Stack_10c28 = (_func_int **)&PTR__TPZFMatrix_018b55d8;
        TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_018b55d8;
        TStack_10a68.fSize = 10;
        TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
        TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar11;
        TStack_10a68.fGiven = TStack_10a68.fElem;
        TPZVec<int>::TPZVec(&TStack_10a68.fPivot.super_TPZVec<int>,0);
        TStack_10a68.fPivot.super_TPZVec<int>.fStore = TStack_10a68.fPivot.fExtAlloc;
        TStack_10a68.fPivot.super_TPZVec<int>._vptr_TPZVec =
             (_func_int **)&PTR__TPZManVector_01815498;
        TStack_10a68.fPivot.super_TPZVec<int>.fNElements = 0;
        TStack_10a68.fPivot.super_TPZVec<int>.fNAlloc = 0;
        TStack_10a68.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        TStack_10a68.fWork.fStore = (double *)0x0;
        TStack_10a68.fWork.fNElements = 0;
        TStack_10a68.fWork.fNAlloc = 0;
        if (uVar6 == 0) {
          TStack_10a68.fElem = (double *)0x0;
        }
        else {
          uVar14 = lVar11 * lVar11;
          if (10 < uVar14) {
            TStack_10a68.fElem =
                 (double *)operator_new__(-(ulong)(uVar14 >> 0x3d != 0) | uVar14 * 8);
          }
        }
        pp_Stack_10c30 = (_func_int **)&PTR__TPZFNMatrix_018b52e8;
        TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFNMatrix_018b52e8;
        TPZFMatrix<double>::operator=(&TStack_10a68,0.0);
        TPZManVector<int,_10>::TPZManVector(&TStack_10b90,0);
        TPZPostProcMat::GetPostProcessVarIndexList(this_00,&TStack_10b90.super_TPZVec<int>);
        uVar7 = (**(code **)(*(long *)&(this_00->
                                       super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                                       ).super_TPZMaterialT<double>.super_TPZMaterial + 0x78))
                          (this_00);
        TStack_10c50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        TStack_10c50.fStore = (double *)0x0;
        TStack_10c50.fNElements = 0;
        TStack_10c50.fNAlloc = 0;
        if (0 < iVar4) {
          lStack_10c08 = (long)(int)uVar7;
          iVar5 = 0;
          plStack_10c20 = plVar9;
          pTStack_10c18 = this;
          pTStack_10c10 = this_00;
          do {
            pTVar3 = pTStack_10c18;
            plVar9 = plStack_10c20;
            (**(code **)(*plStack_10c58 + 0x20))(plStack_10c58,iVar5,&TStack_10bc8,&dStack_10c78);
            (**(code **)(*plStack_10c60 + 0x20))(plStack_10c60,iVar5,&TStack_10c00,&dStack_10c68);
            TStack_10490.super_TPZMaterialData.intLocPtIndex = iVar5;
            local_8260.super_TPZMaterialData.intLocPtIndex = iVar5;
            (**(code **)(*(long *)&(pTVar3->super_TPZCompElH1<pzshape::TPZShapePoint>).
                                   super_TPZIntelGen<pzshape::TPZShapePoint>.
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x2a8))(pTVar3,&local_8260,&TStack_10bc8);
            TStack_10490.super_TPZMaterialData.intLocPtIndex = iVar5;
            if (plVar9 != (long *)0x0) {
              (**(code **)(*plVar9 + 0x290))(plVar9,&TStack_10c00,&TStack_10490);
              (**(code **)(*plVar9 + 0x2a8))(plVar9,&TStack_10490,&TStack_10c00);
            }
            if (plVar10 != (long *)0x0) {
              (**(code **)(*plVar10 + 0x2c8))(plVar10,&TStack_10490,&TStack_10c00);
            }
            dStack_10c78 = ABS(local_8260.super_TPZMaterialData.detjac) * dStack_10c78;
            dStack_10c68 = ABS(TStack_10490.super_TPZMaterialData.detjac) * dStack_10c68;
            TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable = (_func_int **)0x0;
            (*((local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->super_TPZVec<double>
              )._vptr_TPZVec[2])
                      (local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore,lStack_10c08,
                       &TStack_107f8);
            uVar15 = (uint)TStack_10b90.super_TPZVec<int>.fNElements;
            if (0 < (int)uVar15) {
              uVar14 = 0;
              lVar17 = 0;
              do {
                iVar1 = TStack_10b90.super_TPZVec<int>.fStore[uVar14];
                plVar9 = (long *)(**(code **)(*(long *)&pTVar2->super_TPZCompEl + 0xb8))(pTVar2);
                uVar8 = (**(code **)(*plVar9 + 0x88))(plVar9,iVar1);
                TPZVec<double>::Resize(&TStack_10c50,(long)(int)uVar8);
                if (iVar1 < 99) {
                  (**(code **)(*plStack_10c80 + 0x88))
                            (plStack_10c80,&TStack_10490,iVar1,&TStack_10c50);
                }
                else {
                  (**(code **)(*(long *)&pTVar2->super_TPZCompEl + 0x1b0))
                            (pTVar2,&TStack_10c00,iVar1,&TStack_10c50);
                }
                if (0 < (int)uVar8) {
                  pdVar12 = ((local_8260.sol.super_TPZVec<TPZManVector<double,_10>_>.fStore)->
                            super_TPZVec<double>).fStore;
                  uVar16 = 0;
                  do {
                    pdVar12[lVar17 + uVar16] = TStack_10c50.fStore[uVar16];
                    uVar16 = uVar16 + 1;
                  } while (uVar8 != uVar16);
                }
                lVar17 = lVar17 + (int)uVar8;
                uVar14 = uVar14 + 1;
              } while (uVar14 != (uVar15 & 0x7fffffff));
            }
            (**(code **)(*(long *)&(pTStack_10c10->
                                   super_TPZMatBase<double,_TPZMatSingleSpaceT<double>,_TPZMatInterfaceSingleSpace<double>_>
                                   ).super_TPZMaterialT<double>.super_TPZMaterial + 200))
                      (dStack_10c78,pTStack_10c10,&local_8260,&TStack_10a68,&TStack_10980);
            iVar5 = iVar5 + 1;
          } while (iVar5 != iVar4);
        }
        TStack_107f8.fElem = adStack_10768;
        TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
        TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
        TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0197d8f8;
        TStack_107f8.fSize = 0x5a;
        TStack_107f8.fGiven = TStack_107f8.fElem;
        TPZVec<int>::TPZVec(&TStack_107f8.fPivot.super_TPZVec<int>,0);
        TStack_107f8.fPivot.super_TPZVec<int>.fStore = TStack_107f8.fPivot.fExtAlloc;
        TStack_107f8.fPivot.super_TPZVec<int>._vptr_TPZVec =
             (_func_int **)&PTR__TPZManVector_01815498;
        TStack_107f8.fPivot.super_TPZVec<int>.fNElements = 0;
        TStack_107f8.fPivot.super_TPZVec<int>.fNAlloc = 0;
        TStack_107f8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        TStack_107f8.fWork.fStore = (double *)0x0;
        TStack_107f8.fWork.fNElements = 0;
        TStack_107f8.fWork.fNAlloc = 0;
        TStack_107f8.fElem = (double *)0x0;
        TStack_107f8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFNMatrix_0197d608;
        TPZFMatrix<double>::operator=(&TStack_107f8,&TStack_10a68);
        TStack_108e0.fElem = adStack_10850;
        TStack_108e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
        TStack_108e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        TStack_108e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        TStack_108e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             pp_Stack_10c28;
        TStack_108e0.fSize = 10;
        TStack_108e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar11;
        TStack_108e0.fGiven = TStack_108e0.fElem;
        TPZVec<int>::TPZVec(&TStack_108e0.fPivot.super_TPZVec<int>,0);
        TStack_108e0.fPivot.super_TPZVec<int>.fStore = TStack_108e0.fPivot.fExtAlloc;
        TStack_108e0.fPivot.super_TPZVec<int>._vptr_TPZVec =
             (_func_int **)&PTR__TPZManVector_01815498;
        TStack_108e0.fPivot.super_TPZVec<int>.fNElements = 0;
        TStack_108e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
        TStack_108e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        TStack_108e0.fWork.fStore = (double *)0x0;
        TStack_108e0.fWork.fNElements = 0;
        TStack_108e0.fWork.fNAlloc = 0;
        if (uVar6 == 0) {
          TStack_108e0.fElem = (double *)0x0;
        }
        else if (10 < (int)uVar6) {
          TStack_108e0.fElem = (double *)operator_new__(lVar11 * 8);
        }
        TStack_108e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             pp_Stack_10c30;
        TPZFMatrix<double>::operator=(&TStack_108e0,0.0);
        if (0 < (int)uVar7) {
          uVar14 = 0;
          do {
            TPZMatrix<double>::GetSub
                      (&TStack_10980.super_TPZMatrix<double>,uVar14 * lVar11,0,lVar11,1,
                       &TStack_108e0);
            TStack_10b48.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
            TStack_10b48.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0;
            TStack_10b48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            TStack_10b48.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            TStack_10b48.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01816238;
            TStack_10b48.fSize = 9;
            TStack_10b48.fElem = adStack_10ab8;
            TStack_10b48.fGiven = adStack_10ab8;
            TPZVec<int>::TPZVec(&TStack_10b48.fPivot.super_TPZVec<int>,0);
            TStack_10b48.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_01815498;
            TStack_10b48.fPivot.super_TPZVec<int>.fStore = TStack_10b48.fPivot.fExtAlloc;
            TStack_10b48.fPivot.super_TPZVec<int>.fNElements = 0;
            TStack_10b48.fPivot.super_TPZVec<int>.fNAlloc = 0;
            TStack_10b48.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
            TStack_10b48.fWork.fNAlloc = 0;
            TStack_10b48.fWork.fStore = (double *)0x0;
            TStack_10b48.fWork.fNElements = 0;
            TStack_10b48.fElem = (double *)0x0;
            TStack_10b48.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01815f48;
            TPZFMatrix<double>::operator=(&TStack_10b48,&TStack_108e0);
            iVar4 = (*TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&TStack_10a68);
            if (iVar4 != 0) {
              TPZMatrix<double>::Error
                        ("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar4 = (*TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&TStack_10a68);
            if (iVar4 != 0) {
              (*TStack_10a68.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x43])(&TStack_10a68,&TStack_108e0);
            }
            if (0 < (int)uVar6) {
              uVar18 = 0;
              uVar16 = uVar14;
              do {
                if (((pTStack_10c70->fMat).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                     super_TPZBaseMatrix.fRow <= (long)uVar16) ||
                   ((pTStack_10c70->fMat).super_TPZFMatrix<double>.super_TPZMatrix<double>.
                    super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                (pTStack_10c70->fMat).super_TPZFMatrix<double>.fElem[uVar16] =
                     TStack_108e0.fElem[uVar18];
                uVar18 = uVar18 + 1;
                uVar16 = uVar16 + uVar7;
              } while (uVar6 != uVar18);
            }
            TPZFMatrix<double>::~TPZFMatrix(&TStack_10b48,&PTR_PTR_01816200);
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar7);
        }
        TPZFMatrix<double>::~TPZFMatrix(&TStack_108e0,&PTR_PTR_018b55a0);
        TPZFMatrix<double>::~TPZFMatrix(&TStack_107f8,&PTR_PTR_0197d8c0);
        TStack_10c50._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
        if (TStack_10c50.fStore != (double *)0x0) {
          operator_delete__(TStack_10c50.fStore);
        }
        TPZManVector<int,_10>::~TPZManVector(&TStack_10b90);
        TPZFMatrix<double>::~TPZFMatrix(&TStack_10a68,&PTR_PTR_018b55a0);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error at ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "void TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapePoint>>::CalcResidualInternal(TPZElementMatrixT<TVar> &) [TCOMPEL = TPZCompElH1<pzshape::TPZShapePoint>, TVar = double]"
                   ,0xab);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   " Referred CompEl with different number of integration points\n",0x3d);
      }
      TPZManVector<double,_3>::~TPZManVector(&TStack_10c00);
      TPZManVector<double,_3>::~TPZManVector(&TStack_10bc8);
      TStack_10490.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018c0eb8;
      TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&TStack_10490 + 0x7950));
      TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&TStack_10490 + 0x7070));
      TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
                ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&TStack_10490 + 0x51b0));
      TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&TStack_10490 + 0x48d0));
      TPZMaterialData::~TPZMaterialData(&TStack_10490.super_TPZMaterialData,&PTR_PTR_018c0f20);
      local_8260.super_TPZMaterialData.super_TPZShapeData._0_8_ = &PTR__TPZMaterialDataT_018c0eb8;
      TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7950));
      TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x7070));
      TPZManVector<TPZFNMatrix<30,_double>,_20>::~TPZManVector
                ((TPZManVector<TPZFNMatrix<30,_double>,_20> *)((long)&local_8260 + 0x51b0));
      TPZManVector<TPZManVector<double,_10>,_20>::~TPZManVector
                ((TPZManVector<TPZManVector<double,_10>,_20> *)((long)&local_8260 + 0x48d0));
      TPZMaterialData::~TPZMaterialData(&local_8260.super_TPZMaterialData,&PTR_PTR_018c0f20);
      TPZFMatrix<double>::~TPZFMatrix(&TStack_10980,&PTR_PTR_018ba938);
    }
    return;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Post/pzcompelpostproc.h"
             ,0x103);
}

Assistant:

inline void TPZCompElPostProc<TCOMPEL>::CalcResidualInternal(TPZElementMatrixT<TVar> &ef)
{
    ef.Reset();
    
    this->InitializeElementMatrix(ef);
    
    TPZCompEl * pCompElRef = ReferredElement();
    
    TPZInterpolationSpace * pIntSpRef = dynamic_cast<TPZInterpolationSpace *>(pCompElRef);
    
    TPZMultiphysicsElement *pMultiRef = dynamic_cast<TPZMultiphysicsElement *>(pCompElRef);
    
    TPZPostProcMat * pPostProcMat = dynamic_cast<TPZPostProcMat *>(this->Material());
    
    if(!pPostProcMat) DebugStop();
    
    auto* pMaterialRef =
        dynamic_cast<TPZMatSingleSpaceT<STATE>*>(pCompElRef->Material());
    
    
    if (this->NConnects() == 0) return;///boundary discontinuous elements have this characteristic
    
    int64_t numeq = ef.fMat.Rows();
    TPZFNMatrix<1,STATE> efTemp(numeq,1,0.);
    
    TPZMaterialDataT<STATE> data, dataRef;
    this->InitMaterialData(data);
    if(pIntSpRef)
    {
        pIntSpRef->InitMaterialData(dataRef);
        dataRef.fNeedsSol = true;
        dataRef.p = pIntSpRef->MaxOrder();
    }
    data.p    = this->MaxOrder();
    int dim = this->Reference()->Dimension();
    TPZManVector<REAL,3> intpoint(dim,0.);
    TPZManVector<REAL,3> intpointRef(dim,0);
    REAL weight = 0.;
    REAL weightRef = 0;
  
    TPZIntPoints* pFIntegrationRule = &this->GetIntegrationRule();
    if (!pFIntegrationRule) {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " Integration rule must be used from TPZCompEl. \n";
        DebugStop();
    }
    
    const TPZIntPoints &intrule    = this->GetIntegrationRule();
    const TPZIntPoints &intruleRef = pCompElRef->GetIntegrationRule();
    
    int intrulepoints = intrule.NPoints();
    int intrulepointsRef = intruleRef.NPoints();
    if(intrulepoints != intrulepointsRef)
    {
        PZError << "Error at " << __PRETTY_FUNCTION__ << " Referred CompEl with different number of integration points\n";
        return;
    }
    
    int nshape = this->NShapeF();
    TPZFNMatrix<10,STATE> ekTemp(nshape, nshape, 0.);
    
    TPZManVector<int,10> varIndex;
    pPostProcMat->GetPostProcessVarIndexList(varIndex);
    
    int stackedVarSize = pPostProcMat->NStateVariables();
    TPZVec<STATE> Sol;
    
    for(int int_ind = 0; int_ind < intrulepoints; ++int_ind)
    {
        intrule.   Point(int_ind,intpoint,   weight);
        intruleRef.Point(int_ind,intpointRef,weightRef);
        data   .intLocPtIndex = int_ind;
        dataRef.intLocPtIndex = int_ind;
        this->ComputeRequiredData(data,    intpoint);
        
        /*pIntSpRef ->ComputeShape(intpointRef, dataRef.x, dataRef.jacobian,
         dataRef.axes, dataRef.detjac, dataRef.jacinv,
         dataRef.phi, dataRef.dphix); */
        dataRef.intLocPtIndex = int_ind;
        if(pIntSpRef)
        {
            pIntSpRef->ComputeShape(intpointRef,dataRef);
            pIntSpRef->ComputeRequiredData(dataRef, intpointRef);
        }
        if(pMultiRef)
        {
            pMultiRef->ComputeRequiredData(dataRef, intpointRef);
        }
        weight    *= fabs(data.detjac);
        weightRef *= fabs(dataRef.detjac);
        
//        if(pIntSpRef)
//        {
//            if(!dataequal(data,dataRef)){
//                PZError << "Error at " << __PRETTY_FUNCTION__ << " this and Referred CompEl TPZMaterialData(s) do not match\n";
//                ef.Reset();
//                return;
//            }
//        }
        data.sol[0].Resize(stackedVarSize,0.);
        int64_t index = 0;
        // stacking the solutions to post process.
#ifdef PZ_LOG
        TPZLogger pzcompelpostproclogger("pz.mesh.TPZCompElPostProc");
        if(pzcompelpostproclogger.isDebugEnabled())
        {
            std::stringstream sout;
            sout << "Integration point " << int_ind << " x = " << dataRef.x << " GradSol = " << dataRef.dsol[0] ;
            LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
        }
#endif
        int n_var_indexes = varIndex.NElements();
        for(int var_ind = 0; var_ind < n_var_indexes; var_ind++)
        {
            int variableindex = varIndex[var_ind];
            int nsolvars = pCompElRef->Material()->NSolutionVariables(variableindex);
            Sol.Resize(nsolvars);

            // diferenca entre variavel de interpolacao e variavel de elemento
            if (variableindex < 99) {
                pMaterialRef->Solution(dataRef, variableindex, Sol);
            }
            else {
                pCompElRef->Solution(intpointRef, variableindex, Sol);
            }

#ifdef PZ_LOG
            if(pzcompelpostproclogger.isDebugEnabled())
            {
                std::stringstream sout;
                std::string varname;
                pPostProcMat->GetPostProcVarName(var_ind, varname);
                sout << varname << " -value- " << Sol;
                LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
            }
#endif
            for(int i = 0; i <nsolvars; i++) data.sol[0][index+i] = Sol[i];
            index += nsolvars;
        }
        
        pPostProcMat->Contribute(data,weight,ekTemp,efTemp);
        
    }//loop over integration points
    
    TPZFNMatrix<90,STATE> ekCopy(ekTemp);
    
    TPZFNMatrix<10,STATE> rhsTemp(nshape, 1, 0.);
    for(int i_st = 0; i_st < stackedVarSize; i_st++)
    {
        
        efTemp.GetSub(i_st*nshape, 0, nshape, 1, rhsTemp);
        
        TPZFNMatrix<9,STATE> rhsCopy(rhsTemp);
//        int status = ekTemp.Solve_Cholesky(&(rhsTemp));
        int status = ekTemp.Solve_LU(&(rhsTemp));
#ifdef PZDEBUG
        {
            TPZFNMatrix<9,STATE> result(nshape,1,0.);
            ekCopy.MultAdd(rhsTemp, rhsCopy, result, 1., -1.);
            REAL invRes = Norm(result);
            if(!status ){
                PZError << "Error at " << __PRETTY_FUNCTION__ << " Unable to solve the transference linear system\n";
                ef.Reset();
                return;
            }
            
            if(invRes > 1.e-7)
            {
                PZError << "Error at " << __PRETTY_FUNCTION__
                << " Transference linear system solved with residual norm = "
                << invRes << " at " << i_st << " export variable\n";
            }
        }
#endif
        for(int i_sh = 0; i_sh < nshape; i_sh++)
            ef.fMat(i_sh * stackedVarSize + i_st, 0) = rhsTemp(i_sh);
    }

#ifdef PZ_LOG2
    {
        std::stringstream sout;
        sout << "Element index " << this->fIndex << std::endl;
        ef.fMat.Print("Post Processed ",sout);
        LOGPZ_DEBUG(pzcompelpostproclogger, sout.str())
    }
#endif
    
}